

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O2

TString * luaS_newlstr(lua_State *L,char *str,size_t l)

{
  int *piVar1;
  uint uVar2;
  global_State *pgVar3;
  uint h;
  int iVar4;
  TString *pTVar5;
  anon_union_8_2_b887aad4_for_u *paVar6;
  anon_union_8_2_b887aad4_for_u *paVar7;
  
  if (l < 0x29) {
    pgVar3 = L->l_G;
    h = luaS_hash(str,l,pgVar3->seed);
    uVar2 = (pgVar3->strt).size;
    if ((uVar2 - 1 & uVar2) != 0) {
      __assert_fail("(g->strt.size&(g->strt.size-1))==0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstring.c"
                    ,0xab,"TString *internshrstr(lua_State *, const char *, size_t)");
    }
    if (str == (char *)0x0) {
      __assert_fail("str != ((void*)0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstring.c"
                    ,0xac,"TString *internshrstr(lua_State *, const char *, size_t)");
    }
    paVar7 = (anon_union_8_2_b887aad4_for_u *)((pgVar3->strt).hash + (int)(uVar2 - 1 & h));
    paVar6 = paVar7;
    while (pTVar5 = paVar6->hnext, pTVar5 != (TString *)0x0) {
      if ((pTVar5->shrlen == l) && (iVar4 = bcmp(str,pTVar5 + 1,l), iVar4 == 0)) {
        if (((pgVar3->currentwhite ^ 0x18) & pTVar5->marked) == 0) {
          return pTVar5;
        }
        pTVar5->marked = pTVar5->marked ^ 0x18;
        return pTVar5;
      }
      paVar6 = &pTVar5->u;
    }
    if (((int)uVar2 < 0x40000000) && ((int)uVar2 <= (pgVar3->strt).nuse)) {
      luaS_resize(L,uVar2 * 2);
      uVar2 = (pgVar3->strt).size;
      if ((uVar2 - 1 & uVar2) != 0) {
        __assert_fail("(g->strt.size&(g->strt.size-1))==0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstring.c"
                      ,0xb8,"TString *internshrstr(lua_State *, const char *, size_t)");
      }
      paVar7 = (anon_union_8_2_b887aad4_for_u *)((pgVar3->strt).hash + (int)(uVar2 - 1 & h));
    }
    pTVar5 = createstrobj(L,l,4,h);
    memcpy(pTVar5 + 1,str,l);
    pTVar5->shrlen = (lu_byte)l;
    (pTVar5->u).hnext = (TString *)*(TString **)paVar7;
    paVar7->hnext = pTVar5;
    piVar1 = &(pgVar3->strt).nuse;
    *piVar1 = *piVar1 + 1;
  }
  else {
    if (0x7fffffffffffffe6 < l) {
      luaM_toobig(L);
    }
    pTVar5 = luaS_createlngstrobj(L,l);
    memcpy(pTVar5 + 1,str,l);
  }
  return pTVar5;
}

Assistant:

TString *luaS_newlstr (lua_State *L, const char *str, size_t l) {
  if (l <= LUAI_MAXSHORTLEN)  /* short string? */
    return internshrstr(L, str, l);
  else {
    TString *ts;
    if (l >= (MAX_SIZE - sizeof(TString))/sizeof(char))
      luaM_toobig(L);
    ts = luaS_createlngstrobj(L, l);
    memcpy(getstr(ts), str, l * sizeof(char));
    return ts;
  }
}